

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O3

uint32_t FAudioCOMConstructWithCustomAllocatorEXT
                   (FAudio **ppFAudio,uint8_t version,FAudioMallocFunc customMalloc,
                   FAudioFreeFunc customFree,FAudioReallocFunc customRealloc)

{
  FAudio *pFVar1;
  FAudioMutex pvVar2;
  
  FAudio_PlatformAddRef();
  pFVar1 = (FAudio *)(*customMalloc)(0xe8);
  *ppFAudio = pFVar1;
  SDL_memset(pFVar1,0,0xe8);
  (*ppFAudio)->version = version;
  pvVar2 = FAudio_PlatformCreateMutex();
  (*ppFAudio)->sourceLock = pvVar2;
  pvVar2 = FAudio_PlatformCreateMutex();
  (*ppFAudio)->submixLock = pvVar2;
  pvVar2 = FAudio_PlatformCreateMutex();
  (*ppFAudio)->callbackLock = pvVar2;
  pvVar2 = FAudio_PlatformCreateMutex();
  (*ppFAudio)->operationLock = pvVar2;
  (*ppFAudio)->pMalloc = customMalloc;
  (*ppFAudio)->pFree = customFree;
  (*ppFAudio)->pRealloc = customRealloc;
  (*ppFAudio)->refcount = 1;
  return 0;
}

Assistant:

uint32_t FAudioCOMConstructWithCustomAllocatorEXT(
	FAudio **ppFAudio,
	uint8_t version,
	FAudioMallocFunc customMalloc,
	FAudioFreeFunc customFree,
	FAudioReallocFunc customRealloc
) {
#ifndef FAUDIO_DISABLE_DEBUGCONFIGURATION
	FAudioDebugConfiguration debugInit = {0};
#endif /* FAUDIO_DISABLE_DEBUGCONFIGURATION */
	FAudio_PlatformAddRef();
	*ppFAudio = (FAudio*) customMalloc(sizeof(FAudio));
	FAudio_zero(*ppFAudio, sizeof(FAudio));
	(*ppFAudio)->version = version;
#ifndef FAUDIO_DISABLE_DEBUGCONFIGURATION
	FAudio_SetDebugConfiguration(*ppFAudio, &debugInit, NULL);
#endif /* FAUDIO_DISABLE_DEBUGCONFIGURATION */
	(*ppFAudio)->sourceLock = FAudio_PlatformCreateMutex();
	LOG_MUTEX_CREATE((*ppFAudio), (*ppFAudio)->sourceLock)
	(*ppFAudio)->submixLock = FAudio_PlatformCreateMutex();
	LOG_MUTEX_CREATE((*ppFAudio), (*ppFAudio)->submixLock)
	(*ppFAudio)->callbackLock = FAudio_PlatformCreateMutex();
	LOG_MUTEX_CREATE((*ppFAudio), (*ppFAudio)->callbackLock)
	(*ppFAudio)->operationLock = FAudio_PlatformCreateMutex();
	LOG_MUTEX_CREATE((*ppFAudio), (*ppFAudio)->operationLock)
	(*ppFAudio)->pMalloc = customMalloc;
	(*ppFAudio)->pFree = customFree;
	(*ppFAudio)->pRealloc = customRealloc;
	(*ppFAudio)->refcount = 1;
	return 0;
}